

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O1

void get_split_range<InputData<double,unsigned_long>,WorkerMemory<ImputedData<unsigned_long,double>,double,double>>
               (WorkerMemory<ImputedData<unsigned_long,_double>,_double,_double> *workspace,
               InputData<double,_unsigned_long> *input_data,ModelParams *model_params)

{
  ulong col_num;
  size_t *ix_arr;
  size_t sVar1;
  
  col_num = workspace->col_chosen;
  sVar1 = col_num - input_data->ncols_numeric;
  if (col_num < input_data->ncols_numeric) {
    workspace->col_type = Numeric;
    ix_arr = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (input_data->Xc_indptr == (unsigned_long *)0x0) {
      get_range<double>(ix_arr,input_data->numeric_data + col_num * input_data->nrows,workspace->st,
                        workspace->end,model_params->missing_action,&workspace->xmin,
                        &workspace->xmax,&workspace->unsplittable);
    }
    else {
      get_range<double,unsigned_long>
                (ix_arr,workspace->st,workspace->end,col_num,input_data->Xc,input_data->Xc_ind,
                 input_data->Xc_indptr,model_params->missing_action,&workspace->xmin,
                 &workspace->xmax,&workspace->unsplittable);
    }
  }
  else {
    workspace->col_type = Categorical;
    workspace->col_chosen = sVar1;
    get_categs((workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start,
               input_data->categ_data + input_data->nrows * sVar1,workspace->st,workspace->end,
               input_data->ncat[sVar1],
               (MissingAction)(input_data->categ_data + input_data->nrows * sVar1),
               (workspace->categs).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
               _M_impl.super__Vector_impl_data._M_start,&workspace->npresent,
               &workspace->unsplittable);
  }
  return;
}

Assistant:

void get_split_range(WorkerMemory &workspace, InputData &input_data, ModelParams &model_params)
{
    if (workspace.col_chosen < input_data.ncols_numeric)
    {
        workspace.col_type = Numeric;

        if (input_data.Xc_indptr == NULL)
            get_range(workspace.ix_arr.data(), input_data.numeric_data + input_data.nrows * workspace.col_chosen,
                      workspace.st, workspace.end, model_params.missing_action,
                      workspace.xmin, workspace.xmax, workspace.unsplittable);
        else
            get_range(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.col_chosen,
                      input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                      model_params.missing_action, workspace.xmin, workspace.xmax, workspace.unsplittable);
    }

    else
    {
        workspace.col_type = Categorical;
        workspace.col_chosen -= input_data.ncols_numeric;

        get_categs(workspace.ix_arr.data(), input_data.categ_data + input_data.nrows * workspace.col_chosen,
                   workspace.st, workspace.end, input_data.ncat[workspace.col_chosen],
                   model_params.missing_action, workspace.categs.data(), workspace.npresent, workspace.unsplittable);
    }
}